

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::AssertionResultData::reconstructExpression_abi_cxx11_
          (string *__return_storage_ptr__,AssertionResultData *this)

{
  bool bVar1;
  ulong uVar2;
  string local_58;
  undefined1 local_28 [8];
  ReusableStringStream rss;
  AssertionResultData *this_local;
  
  rss.m_oss = (ostream *)this;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) &&
     (bVar1 = LazyExpression::operator_cast_to_bool(&this->lazyExpression), bVar1)) {
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_28);
    ReusableStringStream::operator<<((ReusableStringStream *)local_28,&this->lazyExpression);
    ReusableStringStream::str_abi_cxx11_(&local_58,(ReusableStringStream *)local_28);
    std::__cxx11::string::operator=((string *)&this->reconstructedExpression,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_28);
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&this->reconstructedExpression);
  return __return_storage_ptr__;
}

Assistant:

std::string AssertionResultData::reconstructExpression() const {

        if( reconstructedExpression.empty() ) {
            if( lazyExpression ) {
                ReusableStringStream rss;
                rss << lazyExpression;
                reconstructedExpression = rss.str();
            }
        }
        return reconstructedExpression;
    }